

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O3

string_t duckdb::BinaryIntegralOperator::Operation<long,duckdb::string_t>(long input,Vector *result)

{
  anon_union_16_2_67f50693_for_value aVar1;
  char cVar2;
  ulong uVar3;
  char *pcVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  string_t target;
  uint local_30;
  undefined4 uStack_2c;
  char *local_28;
  
  if (input == 0) {
    auVar6 = duckdb::StringVector::EmptyString(result,1);
    local_28 = auVar6._8_8_;
    local_30 = auVar6._0_4_;
    uStack_2c = auVar6._4_4_;
    pcVar4 = local_28;
    if (local_30 < 0xd) {
      pcVar4 = (char *)&uStack_2c;
    }
    *pcVar4 = '0';
    uVar3 = auVar6._0_8_ & 0xffffffff;
    if (0xc < uVar3) goto LAB_00765b2d;
    pcVar4 = (char *)((long)&uStack_2c + uVar3);
  }
  else {
    uVar3 = (ulong)input >> 1 | input;
    uVar3 = uVar3 >> 2 | uVar3;
    uVar3 = uVar3 >> 4 | uVar3;
    uVar3 = uVar3 >> 8 | uVar3;
    uVar3 = uVar3 >> 0x10 | uVar3;
    uVar3 = *(ulong *)(&DAT_00779200 + ((uVar3 >> 0x20 | uVar3) * 0x3f79d71b4cb0a89 >> 0x3a) * 8);
    auVar6 = duckdb::StringVector::EmptyString(result,uVar3 + 1);
    local_28 = auVar6._8_8_;
    local_30 = auVar6._0_4_;
    uStack_2c = auVar6._4_4_;
    pcVar4 = local_28;
    if (local_30 < 0xd) {
      pcVar4 = (char *)&uStack_2c;
    }
    do {
      cVar2 = NumericCastImpl<char,_unsigned_long,_false>::Convert
                        ((ulong)(((ulong)input >> (uVar3 & 0x3f) & 1) != 0) + 0x30);
      *pcVar4 = cVar2;
      pcVar4 = pcVar4 + 1;
      bVar5 = uVar3 != 0;
      uVar3 = uVar3 - 1;
    } while (bVar5);
    uVar3 = auVar6._0_8_ & 0xffffffff;
    if (0xc < uVar3) {
LAB_00765b2d:
      uStack_2c = *(undefined4 *)local_28;
      goto LAB_00765b38;
    }
    pcVar4 = (char *)((long)&uStack_2c + uVar3);
  }
  memset(pcVar4,0,0xc - uVar3);
LAB_00765b38:
  aVar1._4_1_ = (undefined1)uStack_2c;
  aVar1._5_1_ = uStack_2c._1_1_;
  aVar1._6_1_ = uStack_2c._2_1_;
  aVar1._7_1_ = uStack_2c._3_1_;
  aVar1.pointer.length = local_30;
  aVar1.pointer.ptr = local_28;
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {

		auto num_leading_zero = CountZeros<uint64_t>::Leading(static_cast<uint64_t>(input));
		idx_t num_bits_to_check = 64 - num_leading_zero;
		D_ASSERT(num_bits_to_check <= sizeof(INPUT_TYPE) * 8);

		idx_t buffer_size = num_bits_to_check;

		// Special case: All bits are zero
		if (buffer_size == 0) {
			auto target = StringVector::EmptyString(result, 1);
			auto output = target.GetDataWriteable();
			*output = '0';
			target.Finalize();
			return target;
		}

		D_ASSERT(buffer_size > 0);
		auto target = StringVector::EmptyString(result, buffer_size);
		auto output = target.GetDataWriteable();

		WriteBinBytes(static_cast<uint64_t>(input), output, buffer_size);

		target.Finalize();
		return target;
	}